

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O1

void sunCreateLogMessage(SUNLogLevel lvl,int rank,char *scope,char *label,char *txt,
                        __va_list_tag *args,char **log_msg)

{
  int iVar1;
  char *__s;
  char *__s_00;
  undefined *puVar2;
  byte bVar3;
  va_list tmp2;
  va_list tmp1;
  
  *log_msg = (char *)0x0;
  tmp1[0].reg_save_area = args->reg_save_area;
  tmp1[0].gp_offset = args->gp_offset;
  tmp1[0].fp_offset = args->fp_offset;
  tmp1[0].overflow_arg_area = args->overflow_arg_area;
  __s = (char *)0x0;
  iVar1 = vsnprintf((char *)0x0,0,txt,tmp1);
  bVar3 = 1;
  if (-1 < iVar1) {
    __s = (char *)malloc((ulong)(iVar1 + 1));
    if (__s != (char *)0x0) {
      tmp2[0].reg_save_area = args->reg_save_area;
      tmp2[0].gp_offset = args->gp_offset;
      tmp2[0].fp_offset = args->fp_offset;
      tmp2[0].overflow_arg_area = args->overflow_arg_area;
      iVar1 = vsnprintf(__s,(ulong)(iVar1 + 1),txt,tmp2);
      bVar3 = (byte)((uint)iVar1 >> 0x1f);
    }
  }
  if (bVar3 != 0) {
    sunCreateLogMessage_cold_1();
  }
  if ((uint)(lvl + SUN_LOGLEVEL_ALL) < 4) {
    puVar2 = &DAT_00110828 + *(int *)(&DAT_00110828 + (ulong)(uint)(lvl + SUN_LOGLEVEL_ALL) * 4);
  }
  else {
    puVar2 = (undefined *)0x0;
  }
  iVar1 = snprintf((char *)0x0,0,"[%s][rank %d][%s][%s] %s\n",puVar2,(ulong)(uint)rank,scope,label,
                   __s);
  __s_00 = (char *)malloc((long)(iVar1 + 1));
  *log_msg = __s_00;
  snprintf(__s_00,(long)(iVar1 + 1),"[%s][rank %d][%s][%s] %s\n",puVar2,(ulong)(uint)rank,scope,
           label,__s);
  free(__s);
  return;
}

Assistant:

void sunCreateLogMessage(SUNLogLevel lvl, int rank, const char* scope,
                         const char* label, const char* txt, va_list args,
                         char** log_msg)
{
  const char* prefix;
  char* formatted_txt;
  int msg_length;

  prefix        = NULL;
  formatted_txt = NULL;
  msg_length    = 0;
  *log_msg      = NULL;

  msg_length = sunvasnprintf(&formatted_txt, txt, args);
  if (msg_length < 0)
  {
    char* fileAndLine = sunCombineFileAndLine(__LINE__ + 1, __FILE__);
    fprintf(stderr, "[ERROR][rank %d][%s][%s] %s\n", rank, fileAndLine,
            __func__, "FATAL LOGGER ERROR: message size too large");
    free(fileAndLine);
  }

  if (lvl == SUN_LOGLEVEL_DEBUG) { prefix = "DEBUG"; }
  else if (lvl == SUN_LOGLEVEL_WARNING) { prefix = "WARNING"; }
  else if (lvl == SUN_LOGLEVEL_INFO) { prefix = "INFO"; }
  else if (lvl == SUN_LOGLEVEL_ERROR) { prefix = "ERROR"; }

  msg_length = snprintf(NULL, 0, "[%s][rank %d][%s][%s] %s\n", prefix, rank,
                        scope, label, formatted_txt);
  *log_msg   = (char*)malloc(msg_length + 1);
  snprintf(*log_msg, msg_length + 1, "[%s][rank %d][%s][%s] %s\n", prefix, rank,
           scope, label, formatted_txt);
  free(formatted_txt);
}